

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tent_dist.hpp
# Opt level: O0

result_type_conflict3 * __thiscall
trng::tent_dist<long_double>::icdf_(tent_dist<long_double> *this,result_type_conflict3 x)

{
  result_type_conflict3 *extraout_RAX;
  result_type_conflict3 *extraout_RAX_00;
  result_type_conflict3 *prVar1;
  char *in_RCX;
  int extraout_EDX;
  int extraout_EDX_00;
  param_type *in_RSI;
  param_type *in_RDI;
  int in_R8D;
  int in_R9D;
  double in_XMM0_Qa;
  longdouble in_stack_00000008;
  
  if ((longdouble)0.5 <= in_stack_00000008) {
    std::sqrt(in_XMM0_Qa);
    param_type::d(&in_RDI->m_,in_RSI);
    param_type::m(in_RDI,in_RSI,extraout_EDX_00,in_RCX,in_R8D,in_R9D);
    prVar1 = extraout_RAX_00;
  }
  else {
    std::sqrt(in_XMM0_Qa);
    param_type::d(&in_RDI->m_,in_RSI);
    param_type::m(in_RDI,in_RSI,extraout_EDX,in_RCX,in_R8D,in_R9D);
    prVar1 = extraout_RAX;
  }
  return prVar1;
}

Assistant:

icdf_(result_type x) const {
      return x < result_type(1) / result_type(2) ? (-1 + math::sqrt(2 * x)) * P.d() + P.m()
                                                 : (1 - math::sqrt(2 - 2 * x)) * P.d() + P.m();
    }